

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::callbackReturnResult
          (FederateState *this,FederateStates lastState,MessageProcessingResult result,
          FederateStates newState)

{
  element_type *peVar1;
  IterationResult result_00;
  ActionMessage bye;
  
  if (lastState != newState) {
    if (newState == ERRORED) {
      if (lastState == FINISHED) {
        return;
      }
      peVar1 = (this->fedCallbacks).
               super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar1->_vptr_FederateOperator[5])
                (peVar1,(ulong)(uint)this->errorCode,(this->errorString)._M_string_length,
                 (this->errorString)._M_dataplus._M_p);
      return;
    }
    if (newState == FINISHED) {
      if (lastState == ERRORED) {
        return;
      }
      (*((this->fedCallbacks).
         super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FederateOperator[4])();
      return;
    }
  }
  if ((MessageProcessingResult)(result & ~ITERATING) != NEXT_STEP) {
    return;
  }
  if (lastState == CREATED) {
LAB_002caec5:
    initCallbackProcessing(this);
  }
  else {
    if (lastState == EXECUTING) {
      updateDataForTimeReturn
                (this,result,
                 (Time)(((this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                       time_requested).internalTimeCode,this->lastIterationRequest);
      result_00 = (result == ITERATING) * '\x02';
    }
    else {
      if (lastState != INITIALIZING) {
        return;
      }
      if (newState == INITIALIZING) {
        updateDataForExecEntry(this,result,this->lastIterationRequest);
        goto LAB_002caec5;
      }
      updateDataForExecEntry(this,result,this->lastIterationRequest);
      result_00 = NEXT_STEP;
    }
    execCallbackProcessing(this,result_00);
  }
  return;
}

Assistant:

void FederateState::callbackReturnResult(FederateStates lastState,
                                         MessageProcessingResult result,
                                         FederateStates newState) noexcept
{
    try {
        // handle some general new states
        if (lastState != newState) {
            switch (newState) {
                case FederateStates::TERMINATING:
                    break;
                case FederateStates::FINISHED:
                    if (lastState != FederateStates::ERRORED) {
                        fedCallbacks->finalize();
                    }
                    return;
                case FederateStates::ERRORED:
                    if (lastState != FederateStates::FINISHED) {
                        fedCallbacks->error_handler(lastErrorCode(), lastErrorString());
                    }
                    return;
                default:
                    break;
            }
        }
        switch (result) {
            case MessageProcessingResult::ITERATING:
            case MessageProcessingResult::NEXT_STEP:
                // these are the only 2 results that warrant further processing
                break;
            default:
                return;
        }
        switch (lastState) {
            case FederateStates::CREATED:
                // this is the only valid transition that hasn't been dealt with yet
                initCallbackProcessing();
                break;
            case FederateStates::INITIALIZING:
                if (newState == FederateStates::INITIALIZING) {
                    updateDataForExecEntry(result, lastIterationRequest);
                    initCallbackProcessing();
                } else {
                    updateDataForExecEntry(result, lastIterationRequest);
                    execCallbackProcessing(IterationResult::NEXT_STEP);
                }
                break;
            case FederateStates::EXECUTING:
                updateDataForTimeReturn(result,
                                        timeCoord->getRequestedTime(),
                                        lastIterationRequest);
                execCallbackProcessing(result == MessageProcessingResult::ITERATING ?
                                           IterationResult::ITERATING :
                                           IterationResult::NEXT_STEP);
                break;
            default:
                break;
        }
    }
    catch (const std::exception& e) {
        if (newState != FederateStates::ERRORED && newState != FederateStates::FINISHED) {
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = e.what();
            mParent->addActionMessage(bye);
        }
    }
    catch (...) {
        if (newState != FederateStates::ERRORED && newState != FederateStates::FINISHED) {
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "unrecognized exception thrown in federate callback";
            mParent->addActionMessage(bye);
        }
    }
}